

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestCase::TestCase
          (TestCase *this,char *a_name,char *a_type_param,SetUpTestCaseFunc set_up_tc,
          TearDownTestCaseFunc tear_down_tc)

{
  SetUpTestCaseFunc p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  bool local_53;
  allocator local_52;
  undefined1 local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  allocator local_31;
  TearDownTestCaseFunc local_30;
  TearDownTestCaseFunc tear_down_tc_local;
  SetUpTestCaseFunc set_up_tc_local;
  char *a_type_param_local;
  char *a_name_local;
  TestCase *this_local;
  
  this->_vptr_TestCase = (_func_int **)&PTR__TestCase_0018b388;
  local_30 = tear_down_tc;
  tear_down_tc_local = set_up_tc;
  set_up_tc_local = (SetUpTestCaseFunc)a_type_param;
  a_type_param_local = a_name;
  a_name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->name_,a_name,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_51 = 0;
  local_53 = set_up_tc_local == (SetUpTestCaseFunc)0x0;
  if (local_53) {
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
    p_Var1 = set_up_tc_local;
    local_51 = 1;
    local_50 = local_a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_a0,(char *)p_Var1,&local_52);
  }
  local_51 = 0;
  local_53 = !local_53;
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::scoped_ptr(&this->type_param_,local_a0);
  if (local_53) {
    std::allocator<char>::~allocator((allocator<char> *)&local_52);
  }
  std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::vector
            (&this->test_info_list_);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x148853);
  this->set_up_tc_ = tear_down_tc_local;
  this->tear_down_tc_ = local_30;
  this->should_run_ = false;
  this->elapsed_time_ = 0;
  TestResult::TestResult(&this->ad_hoc_test_result_);
  return;
}

Assistant:

TestCase::TestCase(const char* a_name, const char* a_type_param,
                   Test::SetUpTestCaseFunc set_up_tc,
                   Test::TearDownTestCaseFunc tear_down_tc)
    : name_(a_name),
      type_param_(a_type_param ? new std::string(a_type_param) : NULL),
      set_up_tc_(set_up_tc),
      tear_down_tc_(tear_down_tc),
      should_run_(false),
      elapsed_time_(0) {
}